

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cpp
# Opt level: O3

int __thiscall sqlite::Connection::Stmt::bind(Stmt *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int sqlite_error_code;
  Logic_error *this_00;
  long *plVar1;
  char *pcVar2;
  undefined4 in_register_0000000c;
  long *plVar3;
  size_type *psVar4;
  undefined4 in_register_00000034;
  allocator local_d1;
  long *local_d0;
  long local_c8;
  long local_c0;
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  string local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  sqlite_error_code =
       sqlite3_bind_double(this->stmt_,CONCAT44(in_register_00000034,__fd),__addr,
                           CONCAT44(in_register_0000000c,__len));
  if (sqlite_error_code == 0) {
    return sqlite_error_code;
  }
  this_00 = (Logic_error *)__cxa_allocate_exception(0x48);
  std::__cxx11::to_string(&local_90,__fd);
  std::operator+(&local_50,"Error binding index ",&local_90);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_d0 = (long *)*plVar1;
  plVar3 = plVar1 + 2;
  if (local_d0 == plVar3) {
    local_c0 = *plVar3;
    uStack_b8 = (undefined4)plVar1[3];
    uStack_b4 = *(undefined4 *)((long)plVar1 + 0x1c);
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *plVar3;
  }
  local_c8 = plVar1[1];
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  sqlite3_errmsg(this->db_);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_d0);
  local_b0._M_dataplus._M_p = (pointer)*plVar1;
  psVar4 = (size_type *)(plVar1 + 2);
  if ((size_type *)local_b0._M_dataplus._M_p == psVar4) {
    local_b0.field_2._M_allocated_capacity = *psVar4;
    local_b0.field_2._8_4_ = (undefined4)plVar1[3];
    local_b0.field_2._12_4_ = *(undefined4 *)((long)plVar1 + 0x1c);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  }
  else {
    local_b0.field_2._M_allocated_capacity = *psVar4;
  }
  local_b0._M_string_length = plVar1[1];
  *plVar1 = (long)psVar4;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  pcVar2 = (char *)sqlite3_sql(this->stmt_);
  std::__cxx11::string::string((string *)&local_70,pcVar2,&local_d1);
  Logic_error::Logic_error(this_00,&local_b0,&local_70,sqlite_error_code,this->db_);
  __cxa_throw(this_00,&Logic_error::typeinfo,Logic_error::~Logic_error);
}

Assistant:

void Connection::Stmt::bind(const int index, const double val)
    {
        int status = sqlite3_bind_double(stmt_, index, val);
        if(status != SQLITE_OK)
        {
            throw Logic_error("Error binding index " +
                std::to_string(index) + ": " + sqlite3_errmsg(db_), sqlite3_sql(stmt_), status, db_);
        }
    }